

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::internal::UnitTestOptions::PatternMatchesString(char *pattern,char *str)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    for (; cVar1 = *pattern, cVar1 == '*'; pattern = pattern + 1) {
      if ((*str != '\0') && (bVar3 = PatternMatchesString(pattern,str + 1), bVar3)) {
        bVar3 = true;
        goto LAB_00144693;
      }
    }
    if (cVar1 == '\0') {
LAB_00144688:
      bVar3 = *str == '\0';
      goto LAB_00144693;
    }
    if (cVar1 == '?') {
      if (*str == '\0') {
LAB_001446ad:
        bVar3 = false;
LAB_00144693:
        if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
          __stack_chk_fail();
        }
        return bVar3;
      }
    }
    else {
      if (cVar1 == ':') goto LAB_00144688;
      if (cVar1 != *str) goto LAB_001446ad;
    }
    pattern = pattern + 1;
    str = str + 1;
  } while( true );
}

Assistant:

bool UnitTestOptions::PatternMatchesString(const char *pattern,
                                           const char *str) {
  switch (*pattern) {
    case '\0':
    case ':':  // Either ':' or '\0' marks the end of the pattern.
      return *str == '\0';
    case '?':  // Matches any single character.
      return *str != '\0' && PatternMatchesString(pattern + 1, str + 1);
    case '*':  // Matches any string (possibly empty) of characters.
      return (*str != '\0' && PatternMatchesString(pattern, str + 1)) ||
          PatternMatchesString(pattern + 1, str);
    default:  // Non-special character.  Matches itself.
      return *pattern == *str &&
          PatternMatchesString(pattern + 1, str + 1);
  }
}